

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_tweak_add
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  secp256k1_ge pk;
  secp256k1_ge_storage s;
  secp256k1_ge sStack_b8;
  secp256k1_ge_storage local_60;
  
  if (output_pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_xonly_pubkey_tweak_add_cold_4();
  }
  else {
    output_pubkey->data[0x30] = '\0';
    output_pubkey->data[0x31] = '\0';
    output_pubkey->data[0x32] = '\0';
    output_pubkey->data[0x33] = '\0';
    output_pubkey->data[0x34] = '\0';
    output_pubkey->data[0x35] = '\0';
    output_pubkey->data[0x36] = '\0';
    output_pubkey->data[0x37] = '\0';
    output_pubkey->data[0x38] = '\0';
    output_pubkey->data[0x39] = '\0';
    output_pubkey->data[0x3a] = '\0';
    output_pubkey->data[0x3b] = '\0';
    output_pubkey->data[0x3c] = '\0';
    output_pubkey->data[0x3d] = '\0';
    output_pubkey->data[0x3e] = '\0';
    output_pubkey->data[0x3f] = '\0';
    output_pubkey->data[0x20] = '\0';
    output_pubkey->data[0x21] = '\0';
    output_pubkey->data[0x22] = '\0';
    output_pubkey->data[0x23] = '\0';
    output_pubkey->data[0x24] = '\0';
    output_pubkey->data[0x25] = '\0';
    output_pubkey->data[0x26] = '\0';
    output_pubkey->data[0x27] = '\0';
    output_pubkey->data[0x28] = '\0';
    output_pubkey->data[0x29] = '\0';
    output_pubkey->data[0x2a] = '\0';
    output_pubkey->data[0x2b] = '\0';
    output_pubkey->data[0x2c] = '\0';
    output_pubkey->data[0x2d] = '\0';
    output_pubkey->data[0x2e] = '\0';
    output_pubkey->data[0x2f] = '\0';
    output_pubkey->data[0x10] = '\0';
    output_pubkey->data[0x11] = '\0';
    output_pubkey->data[0x12] = '\0';
    output_pubkey->data[0x13] = '\0';
    output_pubkey->data[0x14] = '\0';
    output_pubkey->data[0x15] = '\0';
    output_pubkey->data[0x16] = '\0';
    output_pubkey->data[0x17] = '\0';
    output_pubkey->data[0x18] = '\0';
    output_pubkey->data[0x19] = '\0';
    output_pubkey->data[0x1a] = '\0';
    output_pubkey->data[0x1b] = '\0';
    output_pubkey->data[0x1c] = '\0';
    output_pubkey->data[0x1d] = '\0';
    output_pubkey->data[0x1e] = '\0';
    output_pubkey->data[0x1f] = '\0';
    output_pubkey->data[0] = '\0';
    output_pubkey->data[1] = '\0';
    output_pubkey->data[2] = '\0';
    output_pubkey->data[3] = '\0';
    output_pubkey->data[4] = '\0';
    output_pubkey->data[5] = '\0';
    output_pubkey->data[6] = '\0';
    output_pubkey->data[7] = '\0';
    output_pubkey->data[8] = '\0';
    output_pubkey->data[9] = '\0';
    output_pubkey->data[10] = '\0';
    output_pubkey->data[0xb] = '\0';
    output_pubkey->data[0xc] = '\0';
    output_pubkey->data[0xd] = '\0';
    output_pubkey->data[0xe] = '\0';
    output_pubkey->data[0xf] = '\0';
    if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_3();
    }
    else if (internal_pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_xonly_pubkey_tweak_add_cold_2();
    }
    else {
      if (tweak32 != (uchar *)0x0) {
        iVar1 = secp256k1_pubkey_load(ctx,&sStack_b8,(secp256k1_pubkey *)internal_pubkey);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx,&sStack_b8,tweak32);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_ge_to_storage(&local_60,&sStack_b8);
        *(uint64_t *)(output_pubkey->data + 0x30) = local_60.y.n[2];
        *(uint64_t *)(output_pubkey->data + 0x38) = local_60.y.n[3];
        *(uint64_t *)(output_pubkey->data + 0x20) = local_60.y.n[0];
        *(uint64_t *)(output_pubkey->data + 0x28) = local_60.y.n[1];
        *(uint64_t *)(output_pubkey->data + 0x10) = local_60.x.n[2];
        *(uint64_t *)(output_pubkey->data + 0x18) = local_60.x.n[3];
        *(uint64_t *)output_pubkey->data = local_60.x.n[0];
        *(uint64_t *)(output_pubkey->data + 8) = local_60.x.n[1];
        return 1;
      }
      secp256k1_xonly_pubkey_tweak_add_cold_1();
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output_pubkey != NULL);
    memset(output_pubkey, 0, sizeof(*output_pubkey));
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx, &pk, tweak32)) {
        return 0;
    }
    secp256k1_pubkey_save(output_pubkey, &pk);
    return 1;
}